

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsObjectGetProperty(JsValueRef object,JsValueRef propertyId,JsValueRef *value)

{
  anon_class_24_3_d48d2907 fn;
  JsErrorCode JVar1;
  JsValueRef **in_stack_ffffffffffffffc0;
  JsValueRef *local_20;
  JsValueRef *value_local;
  JsValueRef propertyId_local;
  JsValueRef object_local;
  
  fn.propertyId = &local_20;
  fn.object = &value_local;
  fn.value = in_stack_ffffffffffffffc0;
  local_20 = value;
  value_local = (JsValueRef *)propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<false,JsObjectGetProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsObjectGetProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId, _Out_ JsValueRef *value)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(value);
        *value = nullptr;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Assert(propertyRecord != nullptr);

        Js::RecyclableObject * instance = Js::VarTo<Js::RecyclableObject>(object);
        return JsGetPropertyCommon(scriptContext, instance, propertyRecord, value);
    });
}